

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O3

NotificationHandle * __thiscall
jsonrpccxx::notificationHandle<SomeClass,std::__cxx11::string_const&>
          (NotificationHandle *__return_storage_ptr__,jsonrpccxx *this,
          offset_in_SomeClass_to_subr method,SomeClass *instance)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *method_00;
  _Any_data _Stack_68;
  _Manager_type local_58;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(SomeClass **)local_48._M_unused._0_8_ = instance;
  *(jsonrpccxx **)((long)local_48._M_unused._0_8_ + 8) = this;
  *(offset_in_SomeClass_to_subr *)((long)local_48._M_unused._0_8_ + 0x10) = method;
  local_30 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/include/jsonrpccxx/typemapper.hpp:179:51)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/include/jsonrpccxx/typemapper.hpp:179:51)>
             ::_M_manager;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&_Stack_68,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_48);
  notificationHandle<std::__cxx11::string_const&>
            (__return_storage_ptr__,(jsonrpccxx *)_Stack_68._M_pod_data,method_00);
  if (local_58 != (code *)0x0) {
    (*local_58)(&_Stack_68,&_Stack_68,__destroy_functor);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

NotificationHandle notificationHandle(void (T::*method)(ParamTypes...), T &instance) {
    std::function<void(ParamTypes...)> function = [&instance, method](ParamTypes &&... params) -> void {
      return (instance.*method)(std::forward<ParamTypes>(params)...);
    };
    return notificationHandle(function);
  }